

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithComponentGradients3D(PixelBufferAccess *dst,Vec4 *minVal,Vec4 *maxVal)

{
  Vec4 *this;
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector<float,_4> local_58;
  float local_48;
  float local_44;
  float a;
  float b;
  float g;
  float r;
  float p;
  float t;
  float s;
  int x;
  int y;
  int z;
  Vec4 *maxVal_local;
  Vec4 *minVal_local;
  PixelBufferAccess *dst_local;
  
  x = 0;
  _y = maxVal;
  maxVal_local = minVal;
  minVal_local = (Vec4 *)dst;
  while( true ) {
    iVar2 = x;
    iVar1 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)minVal_local);
    if (iVar1 <= iVar2) break;
    s = 0.0;
    while( true ) {
      fVar3 = s;
      iVar2 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)minVal_local);
      if (iVar2 <= (int)fVar3) break;
      t = 0.0;
      while( true ) {
        fVar3 = t;
        iVar2 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)minVal_local);
        if (iVar2 <= (int)fVar3) break;
        fVar3 = (float)(int)t;
        iVar2 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)minVal_local);
        p = (fVar3 + 0.5) / (float)iVar2;
        fVar3 = (float)(int)s;
        iVar2 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)minVal_local);
        r = (fVar3 + 0.5) / (float)iVar2;
        fVar4 = (float)x;
        iVar2 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)minVal_local);
        fVar3 = p;
        g = (fVar4 + 0.5) / (float)iVar2;
        fVar4 = Vector<float,_4>::x(maxVal_local);
        fVar5 = Vector<float,_4>::x(_y);
        b = linearInterpolate(fVar3,fVar4,fVar5);
        fVar3 = r;
        fVar4 = Vector<float,_4>::y(maxVal_local);
        fVar5 = Vector<float,_4>::y(_y);
        a = linearInterpolate(fVar3,fVar4,fVar5);
        fVar3 = g;
        fVar4 = Vector<float,_4>::z(maxVal_local);
        fVar5 = Vector<float,_4>::z(_y);
        local_44 = linearInterpolate(fVar3,fVar4,fVar5);
        fVar5 = p + r + g;
        fVar3 = Vector<float,_4>::w(maxVal_local);
        fVar4 = Vector<float,_4>::w(_y);
        local_48 = linearInterpolate(1.0 - fVar5 / 3.0,fVar3,fVar4);
        this = minVal_local;
        Vector<float,_4>::Vector(&local_58,b,a,local_44,local_48);
        PixelBufferAccess::setPixel((PixelBufferAccess *)this,&local_58,(int)t,(int)s,x);
        t = (float)((int)t + 1);
      }
      s = (float)((int)s + 1);
    }
    x = x + 1;
  }
  return;
}

Assistant:

static void fillWithComponentGradients3D (const PixelBufferAccess& dst, const Vec4& minVal, const Vec4& maxVal)
{
	for (int z = 0; z < dst.getDepth(); z++)
	{
		for (int y = 0; y < dst.getHeight(); y++)
		{
			for (int x = 0; x < dst.getWidth(); x++)
			{
				float s = ((float)x + 0.5f) / (float)dst.getWidth();
				float t = ((float)y + 0.5f) / (float)dst.getHeight();
				float p = ((float)z + 0.5f) / (float)dst.getDepth();

				float r = linearInterpolate(s,						minVal.x(), maxVal.x());
				float g = linearInterpolate(t,						minVal.y(), maxVal.y());
				float b = linearInterpolate(p,						minVal.z(), maxVal.z());
				float a = linearInterpolate(1.0f - (s+t+p)/3.0f,	minVal.w(), maxVal.w());

				dst.setPixel(tcu::Vec4(r, g, b, a), x, y, z);
			}
		}
	}
}